

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

void av1_remove_common(AV1_COMMON *cm)

{
  av1_free_context_buffers(cm);
  aom_free(cm->fc);
  cm->fc = (FRAME_CONTEXT *)0x0;
  aom_free(cm->default_frame_context);
  cm->default_frame_context = (FRAME_CONTEXT *)0x0;
  return;
}

Assistant:

void av1_remove_common(AV1_COMMON *cm) {
  av1_free_context_buffers(cm);

  aom_free(cm->fc);
  cm->fc = NULL;
  aom_free(cm->default_frame_context);
  cm->default_frame_context = NULL;
}